

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O2

void bifsct(bifcxdef *bifctx,int argc)

{
  ushort uVar1;
  ushort uVar2;
  runcxdef *ctx;
  runsdef *prVar3;
  anon_union_8_4_1dda36f5_for_runsv aVar4;
  uchar *puVar5;
  uchar *__src;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint16_t tmp;
  uint siz;
  ulong __n;
  uint uVar9;
  uint l;
  uint local_8c;
  uchar *local_88;
  uchar *p;
  byte *local_78;
  runcxdef *local_70;
  uchar *local_68;
  runsdef stk2;
  runsdef stk1;
  runsdef val;
  
  ctx = bifctx->bifcxrun;
  prVar3 = ctx->runcxsp;
  ctx->runcxsp = prVar3 + -1;
  if (prVar3[-1].runstyp == '\a') {
    stk2.runsv = prVar3[-1].runsv;
    uVar1 = *(ushort *)stk2.runsv.runsvstr;
    uVar9 = (uint)uVar1;
    ctx->runcxsp = prVar3 + -2;
    if (prVar3[-2].runstyp == '\a') {
      aVar4 = prVar3[-2].runsv;
      uVar2 = *(ushort *)aVar4.runsvstr;
      stk1.runsv = aVar4;
      siz = (uint)uVar2;
      if (uVar1 <= uVar2) {
        stk1.runsv = stk2.runsv;
        stk2.runsv = aVar4;
        siz = (uint)uVar1;
        uVar9 = (uint)uVar2;
      }
      stk2.runstyp = '\a';
      stk1.runstyp = '\a';
      local_88 = ctx->runcxhp;
      if ((uint)(*(int *)&ctx->runcxhtop - (int)local_88) <= siz) {
        runhcmp(ctx,siz,2,&stk1,&stk2,(runsdef *)0x0);
        local_88 = ctx->runcxhp;
      }
      local_88 = local_88 + 2;
      local_78 = (byte *)(stk1.runsv.runsvnum + 2);
      local_68 = (uchar *)(stk2.runsv.runsvnum + 2);
      local_8c = siz - 2;
      local_70 = ctx;
      do {
        if (local_8c == 0) {
          val.runsv = (anon_union_8_4_1dda36f5_for_runsv)local_70->runcxhp;
          val.runstyp = '\a';
          *(objnum *)val.runsv.runsvstr = (short)local_88 - val.runsv.runsvobj;
          local_70->runcxhp = local_88;
          runrepush(local_70,&val);
          return;
        }
        uVar6 = datsiz((uint)*local_78,local_78 + 1);
        __n = (ulong)(uVar6 + 1);
        p = local_68;
        l = uVar9 - 2;
        while (l != 0) {
          uVar7 = datsiz((uint)*p,p + 1);
          __src = p;
          if ((uVar6 == uVar7) && (iVar8 = bcmp(local_78,p,__n), puVar5 = local_88, iVar8 == 0)) {
            memcpy(local_88,__src,__n);
            local_88 = puVar5 + __n;
            break;
          }
          lstadv(&p,&l);
        }
        lstadv(&local_78,&local_8c);
      } while( true );
    }
  }
  ctx->runcxerr->errcxptr->erraac = 0;
  runsign(ctx,0x3fc);
}

Assistant:

void bifsct(bifcxdef *bifctx, int argc)
{
    runcxdef *ctx = bifctx->bifcxrun;
    uchar    *l1;
    uchar    *l2;
    uchar    *l3;
    uint      siz1;
    uint      siz2;
    uint      siz3;
    uchar    *p;
    uint      l;
    uint      dsz1;
    uint      dsz2;
    runsdef   val;
    runsdef   stk1, stk2;
    
    bifcntargs(bifctx, 2, argc);
    l1 = runpoplst(ctx);
    siz1 = osrp2(l1);
    l2 = runpoplst(ctx);
    siz2 = osrp2(l2);

    /* make sure the first list is smaller - if not, switch them */
    if (siz1 > siz2)
        l3 = l1, l1 = l2, l2 = l3, siz3 = siz1, siz1 = siz2, siz2 = siz3;
    
    /* size of result is at most size of smaller list (which is now siz1) */
    stk1.runstyp = stk2.runstyp = DAT_LIST;
    stk1.runsv.runsvstr = l1;
    stk2.runsv.runsvstr = l2;
    runhres2(ctx, siz1, 2, &stk1, &stk2);
    l1 = stk1.runsv.runsvstr;
    l2 = stk2.runsv.runsvstr;
    l3 = ctx->runcxhp + 2;

    /* go through list1, and copy each element that is found in list2 */
    for (l1 += 2, l2 += 2, siz1 -= 2, siz2 -= 2 ; siz1 ; lstadv(&l1, &siz1))
    {
        dsz1 = datsiz(*l1, l1 + 1) + 1;
        for (l = siz2, p = l2 ; l ; lstadv(&p, &l))
        {
            dsz2 = datsiz(*p, p + 1) + 1;
#ifndef AMIGA
            if (dsz1 == dsz2 && !memcmp(l1, p, (size_t)dsz1))
#else /* AMIGA */
            if (!memcmp(l1, p, (size_t)dsz1) && (dsz1 == dsz2) )
#endif /* AMIGA */
            {
                memcpy(l3, p, (size_t)dsz1);
                l3 += dsz1;
                break;
            }
        }
    }
    
    /* set up return value, take it out of the heap, and push value */
    val.runsv.runsvstr = ctx->runcxhp;
    val.runstyp = DAT_LIST;
    oswp2(ctx->runcxhp, (uint)(l3 - ctx->runcxhp));
    ctx->runcxhp = l3;
    runrepush(ctx, &val);
}